

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O0

void __thiscall Music_Emu::handle_fade(Music_Emu *this,long out_count,sample_t_conflict1 *out)

{
  int iVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int count;
  sample_t_conflict1 *io;
  int gain;
  int unit;
  int shift;
  int i;
  int local_34;
  short *local_30;
  int local_1c;
  
  for (local_1c = 0; local_1c < in_RSI; local_1c = local_1c + 0x200) {
    iVar1 = int_log(((*(int *)(in_RDI + 0x154) + local_1c) - *(int *)(in_RDI + 0x160)) / 0x200,
                    *(int *)(in_RDI + 0x164),0x4000);
    if (iVar1 < 0x40) {
      *(undefined1 *)(in_RDI + 0x15c) = 1;
      *(undefined1 *)(in_RDI + 0x15d) = 1;
    }
    local_30 = (short *)(in_RDX + (long)local_1c * 2);
    lVar2 = ::min(0x200,in_RSI - local_1c);
    for (local_34 = (int)lVar2; local_34 != 0; local_34 = local_34 + -1) {
      *local_30 = (short)(*local_30 * iVar1 >> 0xe);
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

void Music_Emu::handle_fade( long out_count, sample_t* out )
{
	for ( int i = 0; i < out_count; i += fade_block_size )
	{
		int const shift = 14;
		int const unit = 1 << shift;
		int gain = int_log( (out_time + i - fade_start) / fade_block_size,
				fade_step, unit );
		if ( gain < (unit >> fade_shift) )
			track_ended_ = emu_track_ended_ = true;
		
		sample_t* io = &out [i];
		for ( int count = min( fade_block_size, out_count - i ); count; --count )
		{
			*io = sample_t ((*io * gain) >> shift);
			++io;
		}
	}
}